

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

Aig_Man_t *
Saig_ManDupUnfoldConstrsFunc
          (Aig_Man_t *pAig,int nFrames,int nConfs,int nProps,int fOldAlgo,int fVerbose)

{
  void *pvVar1;
  ulong uVar2;
  Vec_Vec_t *__ptr;
  ulong uVar3;
  Aig_Man_t *pAVar4;
  undefined8 *__ptr_00;
  void *pvVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  Aig_Obj_t *pAVar14;
  uint uVar15;
  size_t __size;
  int iVar16;
  long lVar17;
  
  if (fOldAlgo == 0) {
    __ptr = Ssw_ManFindDirectImplications(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  else {
    __ptr = Saig_ManDetectConstrFunc(pAig,nFrames,nConfs,nProps,fVerbose);
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    uVar3 = (ulong)__ptr->nSize;
    if (0 < (long)uVar3) {
      uVar8 = 0;
      iVar13 = 0;
      do {
        iVar13 = iVar13 + *(int *)((long)__ptr->pArray[uVar8] + 4);
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      if (iVar13 != 0) {
        pAVar4 = Aig_ManDupWithoutPos(pAig);
        uVar3 = (ulong)__ptr->nSize;
        if ((long)uVar3 < 1) {
          iVar13 = 0;
        }
        else {
          uVar8 = 0;
          iVar13 = 0;
          do {
            iVar13 = iVar13 + *(int *)((long)__ptr->pArray[uVar8] + 4);
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
        pAVar4->nConstrs = iVar13 + pAig->nConstrs;
        if (0 < pAig->nTruePos) {
          lVar10 = 0;
          do {
            if (pAig->vCos->nSize <= lVar10) goto LAB_006e478e;
            pvVar5 = pAig->vCos->pArray[lVar10];
            if (((ulong)pvVar5 & 1) != 0) goto LAB_006e47cc;
            uVar3 = *(ulong *)((long)pvVar5 + 8);
            uVar8 = uVar3 & 0xfffffffffffffffe;
            if (uVar8 == 0) {
              pAVar14 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar14 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar8 + 0x28));
            }
            Aig_ObjCreateCo(pAVar4,pAVar14);
            lVar10 = lVar10 + 1;
          } while (lVar10 < pAig->nTruePos);
          uVar3 = (ulong)(uint)__ptr->nSize;
        }
        __ptr_00 = (undefined8 *)malloc(0x10);
        *__ptr_00 = 100;
        pvVar5 = malloc(800);
        __ptr_00[1] = pvVar5;
        uVar8 = 0;
        iVar13 = 0;
        if (0 < (int)uVar3) {
          uVar11 = 100;
          lVar10 = 0;
          do {
            pvVar1 = __ptr->pArray[lVar10];
            if (0 < *(int *)((long)pvVar1 + 4)) {
              lVar7 = 0;
              do {
                uVar3 = *(ulong *)(*(long *)((long)pvVar1 + 8) + lVar7 * 8);
                uVar2 = *(ulong *)((uVar3 & 0xfffffffffffffffe) + 0x28);
                iVar9 = (int)uVar8;
                iVar13 = (int)uVar11;
                if (iVar9 == iVar13) {
                  if (iVar13 < 0x10) {
                    if (pvVar5 == (void *)0x0) {
                      pvVar5 = malloc(0x80);
                    }
                    else {
                      pvVar5 = realloc(pvVar5,0x80);
                    }
                    uVar11 = 0x10;
                  }
                  else {
                    uVar11 = (ulong)(uint)(iVar13 * 2);
                    if (pvVar5 == (void *)0x0) {
                      pvVar5 = malloc(uVar11 * 8);
                    }
                    else {
                      pvVar5 = realloc(pvVar5,uVar11 * 8);
                    }
                  }
                  __ptr_00[1] = pvVar5;
                }
                iVar13 = iVar9 + 1;
                *(ulong *)((long)pvVar5 + (long)iVar9 * 8) = (uint)uVar3 & 1 ^ uVar2;
                if (lVar10 != 0) {
                  lVar12 = (long)iVar13;
                  uVar15 = iVar9 * 2;
                  __size = lVar12 << 4;
                  lVar17 = lVar10;
                  do {
                    uVar15 = uVar15 + 2;
                    pAVar14 = Aig_ObjCreateCi(pAVar4);
                    if ((int)lVar12 == (int)uVar11) {
                      pvVar5 = (void *)__ptr_00[1];
                      if (lVar12 < 0x10) {
                        if (pvVar5 == (void *)0x0) {
                          pvVar5 = malloc(0x80);
                        }
                        else {
                          pvVar5 = realloc(pvVar5,0x80);
                        }
                        __ptr_00[1] = pvVar5;
                        uVar11 = 0x10;
                      }
                      else {
                        if (pvVar5 == (void *)0x0) {
                          pvVar5 = malloc(__size);
                        }
                        else {
                          pvVar5 = realloc(pvVar5,__size);
                        }
                        __ptr_00[1] = pvVar5;
                        uVar11 = (ulong)uVar15;
                      }
                    }
                    else {
                      pvVar5 = (void *)__ptr_00[1];
                    }
                    *(Aig_Obj_t **)((long)pvVar5 + lVar12 * 8) = pAVar14;
                    lVar12 = lVar12 + 1;
                    __size = __size + 0x10;
                    lVar17 = lVar17 + -1;
                  } while (lVar17 != 0);
                  iVar13 = (int)lVar12;
                }
                if (iVar13 < 1) {
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
                }
                pvVar5 = (void *)__ptr_00[1];
                uVar8 = (ulong)(iVar13 - 1U);
                Aig_ObjCreateCo(pAVar4,*(Aig_Obj_t **)((long)pvVar5 + uVar8 * 8));
                lVar7 = lVar7 + 1;
              } while (lVar7 < *(int *)((long)pvVar1 + 4));
              *(uint *)((long)__ptr_00 + 4) = iVar13 - 1U;
              *(int *)__ptr_00 = (int)uVar11;
              uVar3 = (ulong)(uint)__ptr->nSize;
            }
            iVar13 = (int)uVar8;
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)uVar3);
        }
        if (0 < pAig->nRegs) {
          iVar9 = 0;
          do {
            uVar15 = pAig->nTruePos + iVar9;
            if (((int)uVar15 < 0) || (pAig->vCos->nSize <= (int)uVar15)) {
LAB_006e478e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar1 = pAig->vCos->pArray[uVar15];
            if (((ulong)pvVar1 & 1) != 0) {
LAB_006e47cc:
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                            ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
            }
            uVar3 = *(ulong *)((long)pvVar1 + 8);
            uVar8 = uVar3 & 0xfffffffffffffffe;
            if (uVar8 == 0) {
              pAVar14 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar14 = (Aig_Obj_t *)((ulong)((uint)uVar3 & 1) ^ *(ulong *)(uVar8 + 0x28));
            }
            Aig_ObjCreateCo(pAVar4,pAVar14);
            iVar9 = iVar9 + 1;
          } while (iVar9 < pAig->nRegs);
          uVar3 = (ulong)(uint)__ptr->nSize;
        }
        if ((int)uVar3 < 1) {
          iVar9 = 0;
        }
        else {
          lVar10 = 0;
          uVar8 = 0;
          do {
            pvVar1 = __ptr->pArray[lVar10];
            iVar9 = *(int *)((long)pvVar1 + 4);
            if (0 < iVar9) {
              iVar6 = 0;
              do {
                if (lVar10 != 0) {
                  iVar16 = (int)uVar8;
                  lVar7 = 0;
                  do {
                    if ((iVar16 < 0) || (iVar13 <= iVar16 + (int)lVar7)) goto LAB_006e478e;
                    Aig_ObjCreateCo(pAVar4,*(Aig_Obj_t **)((long)pvVar5 + lVar7 * 8 + uVar8 * 8));
                    lVar7 = lVar7 + 1;
                  } while (lVar10 != lVar7);
                  iVar9 = *(int *)((long)pvVar1 + 4);
                  uVar8 = (ulong)(uint)(iVar16 + (int)lVar10);
                }
                iVar6 = iVar6 + 1;
              } while (iVar6 < iVar9);
              uVar3 = (ulong)(uint)__ptr->nSize;
            }
            iVar9 = (int)uVar8;
            lVar10 = lVar10 + 1;
          } while (lVar10 < (int)uVar3);
        }
        if (iVar9 != iVar13) {
          __assert_fail("nNewFlops == Vec_PtrSize(vNewFlops)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr2.c"
                        ,0x39c,
                        "Aig_Man_t *Saig_ManDupUnfoldConstrsFunc(Aig_Man_t *, int, int, int, int, int)"
                       );
        }
        Aig_ManSetRegNum(pAVar4,iVar13 + pAig->nRegs);
        iVar13 = __ptr->nSize;
        if (0 < iVar13) {
          lVar10 = 0;
          do {
            pvVar1 = __ptr->pArray[lVar10];
            if (pvVar1 != (void *)0x0) {
              if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar1 + 8));
              }
              free(pvVar1);
              iVar13 = __ptr->nSize;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar13);
        }
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
        if (pvVar5 != (void *)0x0) {
          free(pvVar5);
        }
        free(__ptr_00);
        return pAVar4;
      }
      if (0 < __ptr->nSize) {
        lVar10 = 0;
        do {
          pvVar5 = __ptr->pArray[lVar10];
          if (pvVar5 != (void *)0x0) {
            if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar5 + 8));
            }
            free(pvVar5);
            uVar3 = (ulong)(uint)__ptr->nSize;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar3);
      }
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  pAVar4 = Aig_ManDupDfs(pAig);
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManDupUnfoldConstrsFunc( Aig_Man_t * pAig, int nFrames, int nConfs, int nProps, int fOldAlgo, int fVerbose )
{
    Aig_Man_t * pNew;
    Vec_Vec_t * vCands;
    Vec_Ptr_t * vNodes, * vNewFlops;
    Aig_Obj_t * pObj;
    int i, j, k, nNewFlops;
    if ( fOldAlgo )
        vCands = Saig_ManDetectConstrFunc( pAig, nFrames, nConfs, nProps, fVerbose );
    else
        vCands = Ssw_ManFindDirectImplications( pAig, nFrames, nConfs, nProps, fVerbose );
    if ( vCands == NULL || Vec_VecSizeSize(vCands) == 0 )
    {
        Vec_VecFreeP( &vCands );
        return Aig_ManDupDfs( pAig );
    }
    // create new manager
    pNew = Aig_ManDupWithoutPos( pAig );
    pNew->nConstrs = pAig->nConstrs + Vec_VecSizeSize(vCands);
    // add normal POs
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create constraint outputs
    vNewFlops = Vec_PtrAlloc( 100 );
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Vec_PtrPush( vNewFlops, Aig_ObjRealCopy(pObj) );
            for ( j = 0; j < i; j++ )
                Vec_PtrPush( vNewFlops, Aig_ObjCreateCi(pNew) );
            Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrPop(vNewFlops) );
        }
    }
    // add latch outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // add new latch outputs
    nNewFlops = 0;
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            for ( j = 0; j < i; j++ )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vNewFlops, nNewFlops++) );
        }
    }
    assert( nNewFlops == Vec_PtrSize(vNewFlops) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(pAig) + nNewFlops );
    Vec_VecFreeP( &vCands );
    Vec_PtrFree( vNewFlops );
    return pNew;
}